

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3AddGenerated(Parse *pParse,Expr *pExpr,Token *pType)

{
  ushort uVar1;
  Table *pTab;
  Column *pCVar2;
  uint uVar3;
  int iVar4;
  u8 uVar5;
  long lVar6;
  Column *pCol;
  Expr *pExpr_00;
  
  pTab = pParse->pNewTable;
  if (pTab == (Table *)0x0) goto LAB_0015fd3f;
  if (pParse->eParseMode == '\x01') {
    sqlite3ErrorMsg(pParse,"virtual tables cannot use computed columns");
    goto LAB_0015fd3f;
  }
  pCVar2 = pTab->aCol;
  lVar6 = (long)pTab->nCol;
  pCol = pCVar2 + lVar6 + -1;
  if (pCVar2[lVar6 + -1].iDflt == 0) {
    if (pType == (Token *)0x0) {
LAB_0015fd7f:
      pTab->nNVCol = pTab->nNVCol + -1;
      uVar3 = 0x20;
LAB_0015fd86:
      uVar1 = pCVar2[lVar6 + -1].colFlags;
      pCVar2[lVar6 + -1].colFlags = uVar1 | (ushort)uVar3;
      pTab->tabFlags = pTab->tabFlags | uVar3;
      if ((uVar1 & 1) != 0) {
        makeColumnPartOfPrimaryKey(pParse,pCol);
      }
      if (pExpr == (Expr *)0x0) {
        pExpr_00 = (Expr *)0x0;
      }
      else {
        uVar5 = pExpr->op;
        if (uVar5 == '<') {
          pExpr = sqlite3PExpr(pParse,0xad,pExpr,(Expr *)0x0);
          pExpr_00 = (Expr *)0x0;
          if (pExpr == (Expr *)0x0) goto LAB_0015fe08;
          uVar5 = pExpr->op;
        }
        pExpr_00 = pExpr;
        if (uVar5 != 'H') {
          pExpr->affExpr = pCVar2[lVar6 + -1].affinity;
        }
      }
LAB_0015fe08:
      sqlite3ColumnSetExpr(pParse,pTab,pCol,pExpr_00);
      pExpr = (Expr *)0x0;
      goto LAB_0015fd3f;
    }
    if (pType->n == 6) {
      iVar4 = sqlite3_strnicmp("stored",pType->z,6);
      if (iVar4 == 0) {
        uVar3 = 0x40;
        goto LAB_0015fd86;
      }
    }
    else if (pType->n == 7) {
      iVar4 = sqlite3_strnicmp("virtual",pType->z,7);
      if (iVar4 == 0) goto LAB_0015fd7f;
    }
  }
  sqlite3ErrorMsg(pParse,"error in generated column \"%s\"",pCol->zCnName);
LAB_0015fd3f:
  sqlite3ExprDelete(pParse->db,pExpr);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AddGenerated(Parse *pParse, Expr *pExpr, Token *pType){
#ifndef SQLITE_OMIT_GENERATED_COLUMNS
  u8 eType = COLFLAG_VIRTUAL;
  Table *pTab = pParse->pNewTable;
  Column *pCol;
  if( pTab==0 ){
    /* generated column in an CREATE TABLE IF NOT EXISTS that already exists */
    goto generated_done;
  }
  pCol = &(pTab->aCol[pTab->nCol-1]);
  if( IN_DECLARE_VTAB ){
    sqlite3ErrorMsg(pParse, "virtual tables cannot use computed columns");
    goto generated_done;
  }
  if( pCol->iDflt>0 ) goto generated_error;
  if( pType ){
    if( pType->n==7 && sqlite3StrNICmp("virtual",pType->z,7)==0 ){
      /* no-op */
    }else if( pType->n==6 && sqlite3StrNICmp("stored",pType->z,6)==0 ){
      eType = COLFLAG_STORED;
    }else{
      goto generated_error;
    }
  }
  if( eType==COLFLAG_VIRTUAL ) pTab->nNVCol--;
  pCol->colFlags |= eType;
  assert( TF_HasVirtual==COLFLAG_VIRTUAL );
  assert( TF_HasStored==COLFLAG_STORED );
  pTab->tabFlags |= eType;
  if( pCol->colFlags & COLFLAG_PRIMKEY ){
    makeColumnPartOfPrimaryKey(pParse, pCol); /* For the error message */
  }
  if( ALWAYS(pExpr) && pExpr->op==TK_ID ){
    /* The value of a generated column needs to be a real expression, not
    ** just a reference to another column, in order for covering index
    ** optimizations to work correctly.  So if the value is not an expression,
    ** turn it into one by adding a unary "+" operator. */
    pExpr = sqlite3PExpr(pParse, TK_UPLUS, pExpr, 0);
  }
  if( pExpr && pExpr->op!=TK_RAISE ) pExpr->affExpr = pCol->affinity;
  sqlite3ColumnSetExpr(pParse, pTab, pCol, pExpr);
  pExpr = 0;
  goto generated_done;

generated_error:
  sqlite3ErrorMsg(pParse, "error in generated column \"%s\"",
                  pCol->zCnName);
generated_done:
  sqlite3ExprDelete(pParse->db, pExpr);
#else
  /* Throw and error for the GENERATED ALWAYS AS clause if the
  ** SQLITE_OMIT_GENERATED_COLUMNS compile-time option is used. */
  sqlite3ErrorMsg(pParse, "generated columns not supported");
  sqlite3ExprDelete(pParse->db, pExpr);
#endif
}